

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O3

void __thiscall Pl_PNGFilter::decodeAverage(Pl_PNGFilter *this)

{
  uchar *puVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  ulong uVar5;
  ushort uVar6;
  
  if (this->bytes_per_row != 0) {
    puVar3 = this->cur_row;
    puVar4 = this->prev_row;
    uVar2 = this->bytes_per_pixel;
    uVar5 = 0;
    do {
      if (uVar5 < uVar2) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ushort)puVar3[(ulong)((int)uVar5 - uVar2) + 1];
      }
      puVar1 = puVar3 + uVar5 + 1;
      *puVar1 = *puVar1 + (char)((uint)uVar6 + (uint)puVar4[uVar5 + 1] >> 1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->bytes_per_row);
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodeAverage()
{
    QTC::TC("libtests", "Pl_PNGFilter decodeAverage");
    unsigned char* buffer = this->cur_row + 1;
    unsigned char* above_buffer = this->prev_row + 1;
    unsigned int bpp = this->bytes_per_pixel;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        int left = 0;
        int up = 0;

        if (i >= bpp) {
            left = buffer[i - bpp];
        }

        up = above_buffer[i];
        buffer[i] = static_cast<unsigned char>(buffer[i] + (left + up) / 2);
    }
}